

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O2

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  char cVar1;
  bool bVar2;
  int iVar3;
  char *__s;
  size_t sVar4;
  Vec_Int_t *p;
  char *pcVar5;
  size_t sVar6;
  int Entry;
  char *pcVar7;
  int i;
  
  __s = Extra_FileReadContents(pFileName);
  sVar4 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  p = Vec_IntAlloc(vNames->nSize);
  bVar2 = true;
  Entry = -1;
  pcVar7 = __s;
  do {
    cVar1 = *pcVar7;
    if (cVar1 == '\n') {
      Entry = ((int)pcVar7 - (int)__s) + 1;
    }
    else if (cVar1 == '(') {
      if (bVar2) {
        bVar2 = false;
      }
      else {
        pcVar7 = strtok(pcVar7 + 1,"  \n\r\t");
        for (i = 0; i < vNames->nSize; i = i + 1) {
          pcVar5 = (char *)Vec_PtrEntry(vNames,i);
          iVar3 = strcmp(pcVar5,pcVar7);
          if (iVar3 == 0) {
            Vec_IntPush(p,Entry);
            Vec_IntPush(p,i);
          }
        }
        sVar6 = strlen(pcVar7);
        pcVar7 = pcVar7 + (sVar6 - 1);
        do {
          pcVar5 = pcVar7 + 1;
          pcVar7 = pcVar7 + 1;
        } while (*pcVar5 == '\0');
        if (__s + sVar4 <= pcVar7) {
          __assert_fail("pTemp < pLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                        ,0x2b9,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
        }
        bVar2 = false;
      }
    }
    else if (cVar1 == '\0') {
      if (p->nSize == vNames->nSize * 2) {
        free(__s);
        return p;
      }
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x2bd,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    pcVar7 = pcVar7 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t" );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}